

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

void __thiscall
nonstd::optional_lite::optional<tinyusdz::ascii::Identifier>::
initialize<tinyusdz::ascii::Identifier>
          (optional<tinyusdz::ascii::Identifier> *this,Identifier *value)

{
  bool bVar1;
  Identifier *value_local;
  optional<tinyusdz::ascii::Identifier> *this_local;
  
  bVar1 = has_value(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("! has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                  ,0x5dd,
                  "void nonstd::optional_lite::optional<tinyusdz::ascii::Identifier>::initialize(V &&) [T = tinyusdz::ascii::Identifier, V = tinyusdz::ascii::Identifier]"
                 );
  }
  detail::storage_t<tinyusdz::ascii::Identifier>::construct_value
            ((storage_t<tinyusdz::ascii::Identifier> *)&this->contained,value);
  this->has_value_ = true;
  return;
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }